

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<long,long>::
Flush<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>
          (BitpackingState<long,long> *this)

{
  BitpackingState<long,long> *result;
  long *plVar1;
  long lVar2;
  long *values;
  bool bVar3;
  BitpackingState<long,long> BVar4;
  byte bVar5;
  unsigned_long uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  ulong uVar12;
  
  bVar11 = true;
  if (*(idx_t *)(this + 0x8810) != 0) {
    if (((this[0x8861] == (BitpackingState<long,long>)0x0) &&
        (*(long *)(this + 0x8830) != *(long *)(this + 0x8828))) ||
       (1 < (byte)((char)this[0x8864] - 1U))) {
      result = this + 0x8838;
      BVar4 = (BitpackingState<long,long>)
              TrySubtractOperator::Operation<long,long,long>
                        (*(int64_t *)(this + 0x8830),*(int64_t *)(this + 0x8828),(int64_t *)result);
      this[0x8863] = BVar4;
      BitpackingState<long,_long>::CalculateDeltaStats((BitpackingState<long,_long> *)this);
      if (this[0x8862] == (BitpackingState<long,long>)0x1) {
        lVar2 = *(long *)(this + 0x8840);
        if ((*(long *)(this + 0x8848) == lVar2) && (((byte)this[0x8864] & 0xfe) != 4)) {
          BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstantDelta
                    (*(long *)(this + 0x8848),**(long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                     *(long **)(this + 0x4008),(bool *)(this + 0x8010),*(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x14;
          return true;
        }
        uVar9 = *(ulong *)(this + 0x8850);
        bVar10 = 0;
        bVar5 = bVar10;
        if (uVar9 != 0) {
          do {
            bVar10 = bVar10 + 1;
            bVar3 = 1 < uVar9;
            uVar9 = (long)uVar9 >> 1;
          } while (bVar3);
          bVar5 = 0x40;
          if (bVar10 < 0x39) {
            bVar5 = bVar10;
          }
        }
        uVar9 = *(ulong *)result;
        if (uVar9 == 0) {
          bVar8 = 0;
        }
        else {
          uVar12 = -uVar9;
          if (0 < (long)uVar9) {
            uVar12 = uVar9;
          }
          bVar10 = 0;
          do {
            bVar7 = bVar10;
            bVar10 = bVar7 + 1;
            bVar3 = 1 < uVar12;
            uVar12 = uVar12 >> 1;
          } while (bVar3);
          bVar8 = 0x40;
          if (bVar10 < 0x38) {
            bVar8 = bVar7 + 2;
          }
        }
        BVar4 = this[0x8864];
        if (BVar4 != (BitpackingState<long,long>)0x5 && bVar5 < bVar8) {
          if (*(long *)(this + 0x8810) != 0) {
            uVar9 = 0;
            do {
              *(long *)(this + uVar9 * 8 + 0x4010) = *(long *)(this + uVar9 * 8 + 0x4010) - lVar2;
              uVar9 = uVar9 + 1;
            } while (uVar9 < *(ulong *)(this + 0x8810));
          }
          BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteDeltaFor
                    ((long *)(this + 0x4010),(bool *)(this + 0x8010),bVar5,*(long *)(this + 0x8840),
                     *(long *)(this + 0x8858),*(long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                     *(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x18;
          uVar9 = *(ulong *)(this + 0x8810);
          if ((uVar9 & 0x1f) != 0) {
            uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
            uVar9 = (uVar9 - uVar6) + 0x20;
          }
          *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (bVar5 * uVar9 >> 3);
          if (BVar4 != (BitpackingState<long,long>)0x5 && bVar5 < bVar8) {
            return true;
          }
        }
      }
      if (this[0x8863] == (BitpackingState<long,long>)0x1) {
        if (*(ulong *)result == 0) {
          bVar5 = 0;
        }
        else {
          bVar10 = 0;
          uVar9 = *(ulong *)result;
          do {
            bVar10 = bVar10 + 1;
            bVar3 = 1 < uVar9;
            uVar9 = (long)uVar9 >> 1;
          } while (bVar3);
          bVar5 = 0x40;
          if (bVar10 < 0x39) {
            bVar5 = bVar10;
          }
        }
        values = *(long **)(this + 0x4008);
        if (*(long *)(this + 0x8810) != 0) {
          lVar2 = *(long *)(this + 0x8828);
          uVar9 = 0;
          do {
            plVar1 = values + uVar9;
            *plVar1 = *plVar1 - lVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(ulong *)(this + 0x8810));
        }
        BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
                  (values,(bool *)(this + 0x8010),bVar5,*(long *)(this + 0x8828),
                   *(idx_t *)(this + 0x8810),*(void **)(this + 0x8820));
        uVar9 = *(ulong *)(this + 0x8810);
        if ((uVar9 & 0x1f) != 0) {
          uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
          uVar9 = (uVar9 - uVar6) + 0x20;
        }
        *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (bVar5 * uVar9 >> 3) + 0x10;
      }
      else {
        bVar11 = false;
      }
    }
    else {
      BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstant
                (*(long *)(this + 0x8830),*(idx_t *)(this + 0x8810),*(void **)(this + 0x8820),
                 (bool)this[0x8861]);
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0xc;
    }
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}